

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetDataReliablePdu.cpp
# Opt level: O2

bool __thiscall
DIS::SetDataReliablePdu::operator==(SetDataReliablePdu *this,SetDataReliablePdu *rhs)

{
  pointer pFVar1;
  pointer pVVar2;
  bool bVar3;
  bool bVar4;
  size_t idx;
  ulong uVar5;
  size_t idx_1;
  long lVar6;
  
  bVar3 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar3 = (this->_pad1 == rhs->_pad1 &&
          (this->_requiredReliabilityService == rhs->_requiredReliabilityService && bVar3)) &&
          (this->_requestID == rhs->_requestID && this->_pad2 == rhs->_pad2);
  lVar6 = 0;
  for (uVar5 = 0;
      pFVar1 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_fixedDatumRecords).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar5 = uVar5 + 1) {
    bVar4 = FixedDatum::operator==
                      ((FixedDatum *)((long)&pFVar1->_vptr_FixedDatum + lVar6),
                       (FixedDatum *)
                       ((long)&((rhs->_fixedDatumRecords).
                                super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum + lVar6
                       ));
    bVar3 = (bool)(bVar3 & bVar4);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 0;
  for (uVar5 = 0;
      pVVar2 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_variableDatumRecords).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar5 = uVar5 + 1) {
    bVar4 = VariableDatum::operator==
                      ((VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar6),
                       (VariableDatum *)
                       ((long)&((rhs->_variableDatumRecords).
                                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                       lVar6));
    bVar3 = (bool)(bVar3 & bVar4);
    lVar6 = lVar6 + 0x30;
  }
  return bVar3;
}

Assistant:

bool SetDataReliablePdu::operator ==(const SetDataReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        if( ! ( _fixedDatumRecords[idx] == rhs._fixedDatumRecords[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        if( ! ( _variableDatumRecords[idx] == rhs._variableDatumRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }